

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBufferHelper.cpp
# Opt level: O0

StringBufferHelper * __thiscall
StringBufferHelper::GetNextSegmentBySeparator(StringBufferHelper *this,string *separator)

{
  ulong in_RDX;
  allocator local_45;
  int local_44;
  string local_40 [4];
  int position;
  string currentBuffer;
  string *separator_local;
  StringBufferHelper *this_local;
  string *segment;
  
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_40,(ulong)separator);
  local_44 = std::__cxx11::string::find(local_40,in_RDX);
  if (local_44 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"NA",&local_45);
    std::allocator<char>::~allocator((allocator<char> *)&local_45);
  }
  else {
    std::__cxx11::string::substr((ulong)this,(ulong)local_40);
    *(int *)(separator + 0x20) = *(int *)(separator + 0x20) + local_44 + 1;
  }
  std::__cxx11::string::~string(local_40);
  return this;
}

Assistant:

string StringBufferHelper::GetNextSegmentBySeparator(std::string separator) {
    string currentBuffer = _buffer.substr(_currentPosition, _buffer.size());
    int position = currentBuffer.find(separator);

    if (position == string::npos) {
        return "NA";
    }

    string segment = currentBuffer.substr(0, position);
    _currentPosition = _currentPosition + (position + 1);

    return segment;
}